

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Parser
coda_XML_ExternalEntityParserCreate(XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  HASH_TABLE *table;
  HASH_TABLE *table_00;
  STRING_POOL *newPool;
  XML_Bool XVar1;
  XML_Bool XVar2;
  XML_ParamEntityParsing XVar3;
  undefined4 uVar4;
  DTD *oldTable;
  ELEMENT_TYPE *pEVar5;
  XML_Parser pXVar6;
  XML_Parser pXVar7;
  unsigned_long uVar8;
  KEY pXVar9;
  XML_StartElementHandler p_Var10;
  XML_EndElementHandler p_Var11;
  XML_CharacterDataHandler p_Var12;
  XML_ProcessingInstructionHandler p_Var13;
  XML_CommentHandler p_Var14;
  XML_StartCdataSectionHandler p_Var15;
  XML_EndCdataSectionHandler p_Var16;
  XML_DefaultHandler p_Var17;
  XML_UnparsedEntityDeclHandler p_Var18;
  XML_NotationDeclHandler p_Var19;
  XML_StartNamespaceDeclHandler p_Var20;
  XML_EndNamespaceDeclHandler p_Var21;
  XML_NotStandaloneHandler p_Var22;
  XML_ExternalEntityRefHandler p_Var23;
  XML_SkippedEntityHandler p_Var24;
  XML_UnknownEncodingHandler p_Var25;
  XML_ElementDeclHandler p_Var26;
  XML_AttlistDeclHandler p_Var27;
  XML_EntityDeclHandler p_Var28;
  XML_XmlDeclHandler p_Var29;
  uint uVar30;
  XML_Bool XVar31;
  int iVar32;
  XML_Parser parser;
  NAMED *pNVar33;
  XML_Char *pXVar34;
  NAMED *pNVar35;
  PREFIX *pPVar36;
  KEY pXVar37;
  NAMED *pNVar38;
  code *pcVar39;
  DTD *pDVar40;
  XML_Parser pXVar41;
  long lVar42;
  long lVar43;
  XML_Char tmp [2];
  undefined6 uStack_ee;
  
  if (oldParser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  oldTable = oldParser->m_dtd;
  p_Var10 = oldParser->m_startElementHandler;
  p_Var11 = oldParser->m_endElementHandler;
  p_Var12 = oldParser->m_characterDataHandler;
  p_Var13 = oldParser->m_processingInstructionHandler;
  p_Var14 = oldParser->m_commentHandler;
  p_Var15 = oldParser->m_startCdataSectionHandler;
  p_Var16 = oldParser->m_endCdataSectionHandler;
  p_Var17 = oldParser->m_defaultHandler;
  p_Var18 = oldParser->m_unparsedEntityDeclHandler;
  p_Var19 = oldParser->m_notationDeclHandler;
  p_Var20 = oldParser->m_startNamespaceDeclHandler;
  p_Var21 = oldParser->m_endNamespaceDeclHandler;
  p_Var22 = oldParser->m_notStandaloneHandler;
  p_Var23 = oldParser->m_externalEntityRefHandler;
  p_Var24 = oldParser->m_skippedEntityHandler;
  p_Var25 = oldParser->m_unknownEncodingHandler;
  p_Var26 = oldParser->m_elementDeclHandler;
  p_Var27 = oldParser->m_attlistDeclHandler;
  p_Var28 = oldParser->m_entityDeclHandler;
  p_Var29 = oldParser->m_xmlDeclHandler;
  pEVar5 = oldParser->m_declElementType;
  pXVar41 = (XML_Parser)oldParser->m_userData;
  pXVar6 = (XML_Parser)oldParser->m_handlerArg;
  XVar31 = oldParser->m_defaultExpandInternalEntities;
  pXVar7 = oldParser->m_externalEntityRefHandlerArg;
  XVar3 = oldParser->m_paramEntityParsing;
  iVar32 = (oldParser->m_prologState).inEntityValue;
  XVar1 = oldParser->m_ns_triplets;
  uVar8 = oldParser->m_hash_secret_salt;
  XVar2 = oldParser->m_reparseDeferralEnabled;
  pDVar40 = (DTD *)0x0;
  if (context == (XML_Char *)0x0) {
    pDVar40 = oldTable;
  }
  if (oldParser->m_ns == '\0') {
    pXVar34 = (XML_Char *)0x0;
  }
  else {
    pXVar34 = tmp;
    tmp = (XML_Char  [2])CONCAT11('\0',oldParser->m_namespaceSeparator);
  }
  parser = parserCreate(encodingName,&oldParser->m_mem,pXVar34,pDVar40);
  if (parser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  parser->m_startElementHandler = p_Var10;
  parser->m_endElementHandler = p_Var11;
  parser->m_characterDataHandler = p_Var12;
  parser->m_processingInstructionHandler = p_Var13;
  parser->m_commentHandler = p_Var14;
  parser->m_startCdataSectionHandler = p_Var15;
  parser->m_endCdataSectionHandler = p_Var16;
  parser->m_defaultHandler = p_Var17;
  parser->m_unparsedEntityDeclHandler = p_Var18;
  parser->m_notationDeclHandler = p_Var19;
  parser->m_startNamespaceDeclHandler = p_Var20;
  parser->m_endNamespaceDeclHandler = p_Var21;
  parser->m_notStandaloneHandler = p_Var22;
  parser->m_externalEntityRefHandler = p_Var23;
  parser->m_skippedEntityHandler = p_Var24;
  parser->m_unknownEncodingHandler = p_Var25;
  parser->m_elementDeclHandler = p_Var26;
  parser->m_attlistDeclHandler = p_Var27;
  parser->m_entityDeclHandler = p_Var28;
  parser->m_xmlDeclHandler = p_Var29;
  parser->m_declElementType = pEVar5;
  parser->m_userData = pXVar41;
  if (pXVar41 != pXVar6) {
    pXVar41 = parser;
  }
  parser->m_handlerArg = pXVar41;
  if (pXVar7 != oldParser) {
    parser->m_externalEntityRefHandlerArg = pXVar7;
  }
  parser->m_defaultExpandInternalEntities = XVar31;
  parser->m_ns_triplets = XVar1;
  parser->m_hash_secret_salt = uVar8;
  parser->m_reparseDeferralEnabled = XVar2;
  parser->m_parentParser = oldParser;
  parser->m_paramEntityParsing = XVar3;
  (parser->m_prologState).inEntityValue = iVar32;
  if (context == (XML_Char *)0x0) {
    parser->m_isParamEntity = '\x01';
    coda_XmlPrologStateInitExternalEntity(&parser->m_prologState);
    pcVar39 = externalParEntInitProcessor;
LAB_001626a7:
    parser->m_processor = pcVar39;
    return parser;
  }
  pDVar40 = parser->m_dtd;
  _tmp = (oldTable->prefixes).v;
  newPool = &pDVar40->pool;
  table = &pDVar40->prefixes;
  do {
    pNVar33 = hashTableIterNext((HASH_TABLE_ITER *)tmp);
    if (pNVar33 == (NAMED *)0x0) {
      _tmp = (oldTable->attributeIds).v;
      table_00 = &pDVar40->attributeIds;
      goto LAB_00162777;
    }
    pXVar34 = poolCopyString(newPool,pNVar33->name);
  } while ((pXVar34 != (XML_Char *)0x0) &&
          (pNVar33 = lookup(oldParser,table,pXVar34,0x10), pNVar33 != (NAMED *)0x0));
  goto LAB_00162710;
LAB_00162777:
  pNVar33 = hashTableIterNext((HASH_TABLE_ITER *)tmp);
  if (pNVar33 != (NAMED *)0x0) {
    pXVar34 = (pDVar40->pool).ptr;
    if (pXVar34 == (pDVar40->pool).end) {
      XVar31 = poolGrow(newPool);
      if (XVar31 == '\0') goto LAB_00162710;
      pXVar34 = (pDVar40->pool).ptr;
    }
    (pDVar40->pool).ptr = pXVar34 + 1;
    *pXVar34 = '\0';
    pXVar34 = poolCopyString(newPool,pNVar33->name);
    if ((pXVar34 == (XML_Char *)0x0) ||
       (pNVar35 = lookup(oldParser,table_00,pXVar34 + 1,0x18), pNVar35 == (NAMED *)0x0))
    goto LAB_00162710;
    *(undefined1 *)&pNVar35[2].name = *(undefined1 *)&pNVar33[2].name;
    pXVar37 = pNVar33[1].name;
    if (pXVar37 != (KEY)0x0) {
      *(undefined1 *)((long)&pNVar35[2].name + 1) = *(undefined1 *)((long)&pNVar33[2].name + 1);
      pPVar36 = &pDVar40->defaultPrefix;
      if ((PREFIX *)pXVar37 != &oldTable->defaultPrefix) {
        pPVar36 = (PREFIX *)lookup(oldParser,table,*(KEY *)pXVar37,0);
      }
      pNVar35[1].name = (KEY)pPVar36;
    }
    goto LAB_00162777;
  }
  _tmp = (oldTable->elementTypes).v;
  while (pNVar33 = hashTableIterNext((HASH_TABLE_ITER *)tmp), pNVar33 != (NAMED *)0x0) {
    pXVar34 = poolCopyString(newPool,pNVar33->name);
    if ((pXVar34 == (XML_Char *)0x0) ||
       (pNVar35 = lookup(oldParser,&pDVar40->elementTypes,pXVar34,0x28), pNVar35 == (NAMED *)0x0))
    goto LAB_00162710;
    if ((long)*(int *)&pNVar33[3].name != 0) {
      pXVar37 = (KEY)(*(parser->m_mem).malloc_fcn)((long)*(int *)&pNVar33[3].name * 0x18);
      pNVar35[4].name = pXVar37;
      if (pXVar37 == (KEY)0x0) goto LAB_00162710;
    }
    if (pNVar33[2].name != (KEY)0x0) {
      pNVar38 = lookup(oldParser,table_00,*(KEY *)pNVar33[2].name,0);
      pNVar35[2].name = (KEY)pNVar38;
    }
    uVar4 = *(undefined4 *)&pNVar33[3].name;
    *(undefined4 *)&pNVar35[3].name = uVar4;
    *(undefined4 *)((long)&pNVar35[3].name + 4) = uVar4;
    if (pNVar33[1].name != (KEY)0x0) {
      pNVar38 = lookup(oldParser,table,*(KEY *)pNVar33[1].name,0);
      pNVar35[1].name = (KEY)pNVar38;
    }
    lVar43 = 0;
    for (lVar42 = 0; lVar42 < *(int *)&pNVar35[3].name; lVar42 = lVar42 + 1) {
      pNVar38 = lookup(oldParser,table_00,(KEY)**(undefined8 **)(pNVar33[4].name + lVar43),0);
      pXVar37 = pNVar35[4].name;
      *(NAMED **)(pXVar37 + lVar43) = pNVar38;
      pXVar9 = pNVar33[4].name;
      pXVar37[lVar43 + 8] = pXVar9[lVar43 + 8];
      pXVar34 = *(XML_Char **)(pXVar9 + lVar43 + 0x10);
      if (pXVar34 == (XML_Char *)0x0) {
        pXVar37 = pXVar37 + lVar43 + 0x10;
        pXVar37[0] = '\0';
        pXVar37[1] = '\0';
        pXVar37[2] = '\0';
        pXVar37[3] = '\0';
        pXVar37[4] = '\0';
        pXVar37[5] = '\0';
        pXVar37[6] = '\0';
        pXVar37[7] = '\0';
      }
      else {
        pXVar34 = poolCopyString(newPool,pXVar34);
        *(XML_Char **)(pNVar35[4].name + lVar43 + 0x10) = pXVar34;
        if (pXVar34 == (XML_Char *)0x0) goto LAB_00162710;
      }
      lVar43 = lVar43 + 0x18;
    }
  }
  iVar32 = copyEntityTable(oldParser,&pDVar40->generalEntities,newPool,&oldTable->generalEntities);
  if ((iVar32 != 0) &&
     (iVar32 = copyEntityTable(oldParser,&pDVar40->paramEntities,newPool,&oldTable->paramEntities),
     iVar32 != 0)) {
    XVar31 = oldTable->hasParamEntityRefs;
    XVar1 = oldTable->standalone;
    XVar2 = oldTable->paramEntityRead;
    pDVar40->keepProcessing = oldTable->keepProcessing;
    pDVar40->hasParamEntityRefs = XVar31;
    pDVar40->standalone = XVar1;
    pDVar40->paramEntityRead = XVar2;
    pDVar40->in_eldecl = oldTable->in_eldecl;
    pDVar40->scaffold = oldTable->scaffold;
    uVar30 = oldTable->scaffSize;
    pDVar40->contentStringLen = oldTable->contentStringLen;
    pDVar40->scaffSize = uVar30;
    pDVar40->scaffLevel = oldTable->scaffLevel;
    pDVar40->scaffIndex = oldTable->scaffIndex;
    XVar31 = setContext(parser,context);
    if (XVar31 != '\0') {
      pcVar39 = externalEntityInitProcessor;
      goto LAB_001626a7;
    }
  }
LAB_00162710:
  coda_XML_ParserFree(parser);
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XMLCALL
XML_ExternalEntityParserCreate(XML_Parser oldParser, const XML_Char *context,
                               const XML_Char *encodingName) {
  XML_Parser parser = oldParser;
  DTD *newDtd = NULL;
  DTD *oldDtd;
  XML_StartElementHandler oldStartElementHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_SkippedEntityHandler oldSkippedEntityHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler;
  ELEMENT_TYPE *oldDeclElementType;

  void *oldUserData;
  void *oldHandlerArg;
  XML_Bool oldDefaultExpandInternalEntities;
  XML_Parser oldExternalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing;
  int oldInEntityValue;
#endif
  XML_Bool oldns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  unsigned long oldhash_secret_salt;
  XML_Bool oldReparseDeferralEnabled;

  /* Validate the oldParser parameter before we pull everything out of it */
  if (oldParser == NULL)
    return NULL;

  /* Stash the original parser contents on the stack */
  oldDtd = parser->m_dtd;
  oldStartElementHandler = parser->m_startElementHandler;
  oldEndElementHandler = parser->m_endElementHandler;
  oldCharacterDataHandler = parser->m_characterDataHandler;
  oldProcessingInstructionHandler = parser->m_processingInstructionHandler;
  oldCommentHandler = parser->m_commentHandler;
  oldStartCdataSectionHandler = parser->m_startCdataSectionHandler;
  oldEndCdataSectionHandler = parser->m_endCdataSectionHandler;
  oldDefaultHandler = parser->m_defaultHandler;
  oldUnparsedEntityDeclHandler = parser->m_unparsedEntityDeclHandler;
  oldNotationDeclHandler = parser->m_notationDeclHandler;
  oldStartNamespaceDeclHandler = parser->m_startNamespaceDeclHandler;
  oldEndNamespaceDeclHandler = parser->m_endNamespaceDeclHandler;
  oldNotStandaloneHandler = parser->m_notStandaloneHandler;
  oldExternalEntityRefHandler = parser->m_externalEntityRefHandler;
  oldSkippedEntityHandler = parser->m_skippedEntityHandler;
  oldUnknownEncodingHandler = parser->m_unknownEncodingHandler;
  oldElementDeclHandler = parser->m_elementDeclHandler;
  oldAttlistDeclHandler = parser->m_attlistDeclHandler;
  oldEntityDeclHandler = parser->m_entityDeclHandler;
  oldXmlDeclHandler = parser->m_xmlDeclHandler;
  oldDeclElementType = parser->m_declElementType;

  oldUserData = parser->m_userData;
  oldHandlerArg = parser->m_handlerArg;
  oldDefaultExpandInternalEntities = parser->m_defaultExpandInternalEntities;
  oldExternalEntityRefHandlerArg = parser->m_externalEntityRefHandlerArg;
#ifdef XML_DTD
  oldParamEntityParsing = parser->m_paramEntityParsing;
  oldInEntityValue = parser->m_prologState.inEntityValue;
#endif
  oldns_triplets = parser->m_ns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  oldhash_secret_salt = parser->m_hash_secret_salt;
  oldReparseDeferralEnabled = parser->m_reparseDeferralEnabled;

#ifdef XML_DTD
  if (! context)
    newDtd = oldDtd;
#endif /* XML_DTD */

  /* Note that the magical uses of the pre-processor to make field
     access look more like C++ require that `parser' be overwritten
     here.  This makes this function more painful to follow than it
     would be otherwise.
  */
  if (parser->m_ns) {
    XML_Char tmp[2] = {parser->m_namespaceSeparator, 0};
    parser = parserCreate(encodingName, &parser->m_mem, tmp, newDtd);
  } else {
    parser = parserCreate(encodingName, &parser->m_mem, NULL, newDtd);
  }

  if (! parser)
    return NULL;

  parser->m_startElementHandler = oldStartElementHandler;
  parser->m_endElementHandler = oldEndElementHandler;
  parser->m_characterDataHandler = oldCharacterDataHandler;
  parser->m_processingInstructionHandler = oldProcessingInstructionHandler;
  parser->m_commentHandler = oldCommentHandler;
  parser->m_startCdataSectionHandler = oldStartCdataSectionHandler;
  parser->m_endCdataSectionHandler = oldEndCdataSectionHandler;
  parser->m_defaultHandler = oldDefaultHandler;
  parser->m_unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  parser->m_notationDeclHandler = oldNotationDeclHandler;
  parser->m_startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  parser->m_endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  parser->m_notStandaloneHandler = oldNotStandaloneHandler;
  parser->m_externalEntityRefHandler = oldExternalEntityRefHandler;
  parser->m_skippedEntityHandler = oldSkippedEntityHandler;
  parser->m_unknownEncodingHandler = oldUnknownEncodingHandler;
  parser->m_elementDeclHandler = oldElementDeclHandler;
  parser->m_attlistDeclHandler = oldAttlistDeclHandler;
  parser->m_entityDeclHandler = oldEntityDeclHandler;
  parser->m_xmlDeclHandler = oldXmlDeclHandler;
  parser->m_declElementType = oldDeclElementType;
  parser->m_userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    parser->m_handlerArg = parser->m_userData;
  else
    parser->m_handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    parser->m_externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  parser->m_defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  parser->m_ns_triplets = oldns_triplets;
  parser->m_hash_secret_salt = oldhash_secret_salt;
  parser->m_reparseDeferralEnabled = oldReparseDeferralEnabled;
  parser->m_parentParser = oldParser;
#ifdef XML_DTD
  parser->m_paramEntityParsing = oldParamEntityParsing;
  parser->m_prologState.inEntityValue = oldInEntityValue;
  if (context) {
#endif /* XML_DTD */
    if (! dtdCopy(oldParser, parser->m_dtd, oldDtd, &parser->m_mem)
        || ! setContext(parser, context)) {
      XML_ParserFree(parser);
      return NULL;
    }
    parser->m_processor = externalEntityInitProcessor;
#ifdef XML_DTD
  } else {
    /* The DTD instance referenced by parser->m_dtd is shared between the
       document's root parser and external PE parsers, therefore one does not
       need to call setContext. In addition, one also *must* not call
       setContext, because this would overwrite existing prefix->binding
       pointers in parser->m_dtd with ones that get destroyed with the external
       PE parser. This would leave those prefixes with dangling pointers.
    */
    parser->m_isParamEntity = XML_TRUE;
    XmlPrologStateInitExternalEntity(&parser->m_prologState);
    parser->m_processor = externalParEntInitProcessor;
  }
#endif /* XML_DTD */
  return parser;
}